

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

bool __thiscall Js::FunctionBody::HasLineBreak(FunctionBody *this,charcount_t start,charcount_t end)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  char16 cVar4;
  LPCUTF8 puVar5;
  ulong uVar6;
  uint cchIndex;
  int iVar7;
  DecodeOptions local_3c;
  byte *pbStack_38;
  DecodeOptions options;
  
  iVar7 = start - end;
  if (((start < end || iVar7 == 0) &&
      ((this->super_ParseableFunctionInfo).m_cchStartOffset <= start)) &&
     (end - start <= (this->super_ParseableFunctionInfo).m_cchLength)) {
    puVar5 = Utf8SourceInfo::GetSource
                       ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr
                        ,L"FunctionBody::HasLineBreak");
    uVar3 = (this->super_ParseableFunctionInfo).m_cbLength;
    puVar5 = puVar5 + (this->super_ParseableFunctionInfo).m_cbStartOffset;
    cchIndex = start - (this->super_ParseableFunctionInfo).m_cchStartOffset;
    if (uVar3 == (this->super_ParseableFunctionInfo).m_cchLength) {
      uVar6 = (ulong)cchIndex;
    }
    else {
      uVar6 = utf8::CharacterIndexToByteIndex
                        (puVar5,(ulong)uVar3,cchIndex,doAllowThreeByteSurrogates);
    }
    pbStack_38 = puVar5 + uVar6;
    local_3c = doAllowThreeByteSurrogates;
    if (end != start) {
      do {
        if (pbStack_38 < puVar5 + uVar3) {
          pbVar1 = pbStack_38 + 1;
          bVar2 = *pbStack_38;
          cVar4 = (char16)bVar2;
          pbStack_38 = pbVar1;
          if ((char)bVar2 < '\0') {
            cVar4 = utf8::DecodeTail((ushort)bVar2,&stack0xffffffffffffffc8,puVar5 + uVar3,&local_3c
                                     ,(bool *)0x0);
          }
          if ((ushort)cVar4 - 0x2028 < 2) {
            return true;
          }
          if (cVar4 == L'\n') {
            return true;
          }
          if (cVar4 == L'\r') {
            return true;
          }
        }
        iVar7 = iVar7 + 1;
      } while (iVar7 != 0);
    }
  }
  return false;
}

Assistant:

bool FunctionBody::HasLineBreak(charcount_t start, charcount_t end) const
    {
        if (start > end) return false;
        charcount_t cchLength = end - start;
        if (start < this->m_cchStartOffset || cchLength > this->m_cchLength) return false;
        LPCUTF8 src = this->GetSource(_u("FunctionBody::HasLineBreak"));
        LPCUTF8 last = src + this->LengthInBytes();
        size_t offset = this->LengthInBytes() == this->m_cchLength ?
            start - this->m_cchStartOffset :
            utf8::CharacterIndexToByteIndex(src, this->LengthInBytes(), start - this->m_cchStartOffset, utf8::doAllowThreeByteSurrogates);
        src = src + offset;

        utf8::DecodeOptions options = utf8::doAllowThreeByteSurrogates;

        for (charcount_t cch = cchLength; cch > 0; --cch)
        {
            switch (utf8::Decode(src, last, options))
            {
            case '\r':
            case '\n':
            case 0x2028:
            case 0x2029:
                return true;
            }
        }

        return false;
    }